

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O1

void wabt::WriteOpcode(Stream *stream,Opcode opcode)

{
  Opcode local_54;
  char *local_50;
  byte local_2c;
  uint32_t local_28;
  
  local_54.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_54);
  if (local_2c == 0) {
    Opcode::GetInfo(&local_54);
    Opcode::GetInfo(&local_54);
    Stream::WriteU8(stream,local_28,local_50,No);
  }
  else {
    Opcode::GetInfo(&local_54);
    Stream::WriteU8(stream,(uint)local_2c,"prefix",No);
    Opcode::GetInfo(&local_54);
    Opcode::GetInfo(&local_54);
    WriteU32Leb128(stream,local_28,local_50);
  }
  return;
}

Assistant:

void WriteOpcode(Stream* stream, Opcode opcode) {
  if (opcode.HasPrefix()) {
    stream->WriteU8(opcode.GetPrefix(), "prefix");
    WriteU32Leb128(stream, opcode.GetCode(), opcode.GetName());
  } else {
    stream->WriteU8(opcode.GetCode(), opcode.GetName());
  }
}